

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void finish_pass_gather(j_compress_ptr cinfo)

{
  JHUFF_TBL *pJVar1;
  long in_RDI;
  boolean did_ac [4];
  boolean did_dc [4];
  JHUFF_TBL **htblptr;
  jpeg_component_info *compptr;
  int actbl;
  int dctbl;
  int ci;
  huff_entropy_ptr entropy;
  long *in_stack_00000810;
  JHUFF_TBL *in_stack_00000818;
  j_compress_ptr in_stack_00000820;
  int aiStack_58 [2];
  j_common_ptr in_stack_ffffffffffffffb0;
  int local_48 [6];
  long *local_30;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  long local_8;
  
  local_10 = *(undefined8 *)(in_RDI + 0x1f0);
  local_8 = in_RDI;
  memset(local_48,0,0x10);
  memset(aiStack_58,0,0x10);
  for (local_14 = 0; local_14 < *(int *)(local_8 + 0x144); local_14 = local_14 + 1) {
    local_28 = *(long *)(local_8 + 0x148 + (long)local_14 * 8);
    local_18 = *(int *)(local_28 + 0x14);
    local_1c = *(int *)(local_28 + 0x18);
    if (local_48[local_18] == 0) {
      local_30 = (long *)(local_8 + 0x80 + (long)local_18 * 8);
      if (*local_30 == 0) {
        pJVar1 = jpeg_alloc_huff_table(in_stack_ffffffffffffffb0);
        *local_30 = (long)pJVar1;
      }
      jpeg_gen_optimal_table(in_stack_00000820,in_stack_00000818,in_stack_00000810);
      local_48[local_18] = 1;
    }
    if (aiStack_58[local_1c] == 0) {
      local_30 = (long *)(local_8 + 0xa0 + (long)local_1c * 8);
      if (*local_30 == 0) {
        pJVar1 = jpeg_alloc_huff_table(in_stack_ffffffffffffffb0);
        *local_30 = (long)pJVar1;
      }
      jpeg_gen_optimal_table(in_stack_00000820,in_stack_00000818,in_stack_00000810);
      aiStack_58[local_1c] = 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_gather(j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, dctbl, actbl;
  jpeg_component_info *compptr;
  JHUFF_TBL **htblptr;
  boolean did_dc[NUM_HUFF_TBLS];
  boolean did_ac[NUM_HUFF_TBLS];

  /* It's important not to apply jpeg_gen_optimal_table more than once
   * per table, because it clobbers the input frequency counts!
   */
  MEMZERO(did_dc, sizeof(did_dc));
  MEMZERO(did_ac, sizeof(did_ac));

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    if (!did_dc[dctbl]) {
      htblptr = &cinfo->dc_huff_tbl_ptrs[dctbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->dc_count_ptrs[dctbl]);
      did_dc[dctbl] = TRUE;
    }
    if (!did_ac[actbl]) {
      htblptr = &cinfo->ac_huff_tbl_ptrs[actbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->ac_count_ptrs[actbl]);
      did_ac[actbl] = TRUE;
    }
  }
}